

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

tuple<unsigned_long,_unsigned_long,_long> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index::get_coboundary_size_and_gap_and_pivot
          (tuple<unsigned_long,_unsigned_long,_long> *__return_storage_ptr__,
          greater_filtration_or_better_pivot_or_smaller_index *this,index_t a)

{
  bool bVar1;
  filtration_entry_t fVar2;
  long local_78;
  size_t local_70;
  index_t next_index;
  size_t coboundary_size;
  long local_58;
  undefined1 local_50 [8];
  simplex_coboundary_enumerator iterator;
  size_t gap_after_pivot;
  index_t pivot;
  index_t a_local;
  greater_filtration_or_better_pivot_or_smaller_index *this_local;
  
  gap_after_pivot = 0;
  iterator.complex = (delta_complex_t *)0x0;
  pivot = a;
  a_local = (index_t)this;
  this_local = (greater_filtration_or_better_pivot_or_smaller_index *)__return_storage_ptr__;
  filtration_entry_t::filtration_entry_t((filtration_entry_t *)&coboundary_size,&pivot);
  fVar2.super_pair<float,_long>._4_4_ = 0;
  fVar2.super_pair<float,_long>.first = (float)(uint)coboundary_size;
  fVar2.super_pair<float,_long>.second = local_58;
  simplex_coboundary_enumerator::simplex_coboundary_enumerator
            ((simplex_coboundary_enumerator *)local_50,fVar2,this->dimension,this->complex);
  next_index = 0;
  while (bVar1 = simplex_coboundary_enumerator::has_next((simplex_coboundary_enumerator *)local_50),
        bVar1) {
    next_index = next_index + 1;
    fVar2 = simplex_coboundary_enumerator::next((simplex_coboundary_enumerator *)local_50);
    local_78 = fVar2.super_pair<float,_long>.second;
    local_70 = get_index(&local_78);
    if ((long)gap_after_pivot < (long)local_70) {
      iterator.complex = (delta_complex_t *)(local_70 - gap_after_pivot);
      gap_after_pivot = local_70;
    }
  }
  std::make_tuple<unsigned_long&,unsigned_long&,long&>
            (__return_storage_ptr__,(unsigned_long *)&next_index,(unsigned_long *)&iterator.complex,
             (long *)&gap_after_pivot);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(index_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		simplex_coboundary_enumerator iterator(a,dimension,complex);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}